

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::WriteFileHeader(cmGlobalGhsMultiGenerator *this,ostream *fout)

{
  uint uVar1;
  ostream *poVar2;
  string local_38 [32];
  ostream *local_18;
  ostream *fout_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  local_18 = fout;
  fout_local = (ostream *)this;
  poVar2 = std::operator<<(fout,
                           "#!gbuild\n#\n# CMAKE generated file: DO NOT EDIT!\n# Generated by \"");
  GetActualName_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2,"\" Generator, CMake Version ");
  uVar1 = cmVersion::GetMajorVersion();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2,'.');
  uVar1 = cmVersion::GetMinorVersion();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  std::operator<<(poVar2,"\n#\n\n");
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteFileHeader(std::ostream& fout)
{
  /* clang-format off */
  fout << "#!gbuild\n"
          "#\n"
          "# CMAKE generated file: DO NOT EDIT!\n"
          "# Generated by \"" << GetActualName() << "\""
          " Generator, CMake Version " << cmVersion::GetMajorVersion() << '.'
       << cmVersion::GetMinorVersion() << "\n"
          "#\n\n";
  /* clang-format on */
}